

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test::
TestBody(GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test *this)

{
  FooUnion *this_00;
  Descriptor *this_01;
  Reflection *message_00;
  InternalMetadata arena;
  char *pcVar1;
  string_view value;
  string_view name;
  string_view name_00;
  string_view name_01;
  AssertHelper local_80;
  anon_union_16_2_39e9c77e_for_Rep_0 local_78;
  AssertionResult gtest_ar;
  TestOneof2 message;
  
  proto2_unittest::TestOneof2::TestOneof2(&message);
  this_01 = proto2_unittest::TestOneof2::GetDescriptor();
  message_00 = proto2_unittest::TestOneof2::GetReflection();
  value._M_str = "bytes_cord";
  value._M_len = 10;
  proto2_unittest::TestOneof2::set_foo_bytes_cord(&message,value);
  name._M_str = "foo_bytes_cord";
  name._M_len = 0xe;
  Descriptor::FindFieldByName(this_01,name);
  Reflection::GetCord((Reflection *)&local_78.as_tree,(Message *)message_00,
                      (FieldDescriptor *)&message);
  testing::internal::CmpHelperEQ<char[11],absl::lts_20250127::Cord>
            ((internal *)&gtest_ar,"\"bytes_cord\"",
             "reflection->GetCord(message, descriptor->FindFieldByName(\"foo_bytes_cord\"))",
             (char (*) [11])0xdc9dc3,(Cord *)&local_78.as_tree);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_78.as_tree);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78.as_tree);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x621,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78.as_tree);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)local_78.as_tree.cordz_info != (long *)0x0) {
      (**(code **)(*(long *)local_78.as_tree.cordz_info + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  if (message.field_0._impl_._oneof_case_[0] != 2) {
    proto2_unittest::TestOneof2::clear_foo(&message);
    message.field_0._impl_._oneof_case_[0] = 2;
    message.field_0._impl_.foo_ = (FooUnion)&internal::fixed_address_empty_string;
  }
  this_00 = &message.field_0._impl_.foo_;
  arena.ptr_ = message.super_Message.super_MessageLite._internal_metadata_.ptr_;
  if ((message.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    arena.ptr_ = *(undefined8 *)
                  (message.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                  0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&this_00->foo_string_,"foo",(Arena *)arena.ptr_);
  name_00._M_str = "foo_string";
  name_00._M_len = 10;
  Descriptor::FindFieldByName(this_01,name_00);
  Reflection::GetCord((Reflection *)&local_78.as_tree,(Message *)message_00,
                      (FieldDescriptor *)&message);
  testing::internal::CmpHelperEQ<char[4],absl::lts_20250127::Cord>
            ((internal *)&gtest_ar,"\"foo\"",
             "reflection->GetCord( message, descriptor->FindFieldByName(\"foo_string\"))",
             (char (*) [4])0xdd11ec,(Cord *)&local_78.as_tree);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_78.as_tree);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78.as_tree);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x625,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78.as_tree);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)local_78.as_tree.cordz_info != (long *)0x0) {
      (**(code **)(*(long *)local_78.as_tree.cordz_info + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  if (message.field_0._impl_._oneof_case_[0] != 5) {
    proto2_unittest::TestOneof2::clear_foo(&message);
    message.field_0._impl_._oneof_case_[0] = 5;
    message.field_0._impl_.foo_ = (FooUnion)&internal::fixed_address_empty_string;
  }
  if ((message.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    message.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (message.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set
            (&this_00->foo_string_,"bytes",
             (Arena *)message.super_Message.super_MessageLite._internal_metadata_.ptr_);
  name_01._M_str = "foo_bytes";
  name_01._M_len = 9;
  Descriptor::FindFieldByName(this_01,name_01);
  Reflection::GetCord((Reflection *)&local_78.as_tree,(Message *)message_00,
                      (FieldDescriptor *)&message);
  testing::internal::CmpHelperEQ<char[6],absl::lts_20250127::Cord>
            ((internal *)&gtest_ar,"\"bytes\"",
             "reflection->GetCord( message, descriptor->FindFieldByName(\"foo_bytes\"))",
             (char (*) [6])0xf50b2c,(Cord *)&local_78.as_tree);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_78.as_tree);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78.as_tree);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x629,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78.as_tree);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)local_78.as_tree.cordz_info != (long *)0x0) {
      (**(code **)(*(long *)local_78.as_tree.cordz_info + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  proto2_unittest::TestOneof2::~TestOneof2(&message);
  return;
}

Assistant:

TEST_F(GeneratedMessageReflectionCordAccessorsTest, GetOneofCord) {
  unittest::TestOneof2 message;
  const Descriptor* descriptor = unittest::TestOneof2::descriptor();
  const Reflection* reflection = message.GetReflection();

  message.set_foo_bytes_cord("bytes_cord");
  EXPECT_EQ("bytes_cord",
            reflection->GetCord(message,
                                descriptor->FindFieldByName("foo_bytes_cord")));

  message.set_foo_string("foo");
  EXPECT_EQ("foo", reflection->GetCord(
                       message, descriptor->FindFieldByName("foo_string")));

  message.set_foo_bytes("bytes");
  EXPECT_EQ("bytes", reflection->GetCord(
                         message, descriptor->FindFieldByName("foo_bytes")));

}